

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall
c4::yml::Tree::_set_hierarchy(Tree *this,size_t ichild,size_t iparent,size_t iprev_sibling)

{
  code *pcVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  bool bVar11;
  size_t sVar12;
  size_t sVar13;
  long lVar14;
  NodeData *n;
  char *pcVar15;
  char *pcVar16;
  NodeData *pNVar17;
  NodeData *n_00;
  NodeData *n_01;
  byte bVar18;
  char msg [69];
  char local_208 [64];
  undefined4 local_1c8;
  undefined1 local_1c4;
  undefined4 uStack_1b8;
  undefined3 uStack_1b4;
  undefined4 local_1b0;
  undefined1 local_1ac;
  size_t local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  char *pcStack_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  char *pcStack_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  char *pcStack_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  char *pcStack_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  bVar18 = 0;
  if ((iparent != 0xffffffffffffffff) && (this->m_cap <= iparent)) {
    pcVar15 = "check failed: (iparent == NONE || (iparent >= 0 && iparent < m_cap))";
    pcVar16 = local_208;
    for (lVar14 = 8; lVar14 != 0; lVar14 = lVar14 + -1) {
      *(undefined8 *)pcVar16 = *(undefined8 *)pcVar15;
      pcVar15 = pcVar15 + 8;
      pcVar16 = pcVar16 + 8;
    }
    local_1c4 = 0;
    local_1c8 = 0x29297061;
    if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    local_58 = 0;
    uStack_50 = 0x63cb;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x63cb) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x63cb) << 0x40,8);
    LVar2.name.str._0_4_ = 0x200dd7;
    LVar2.name.str._4_4_ = 0;
    LVar2.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_208,0x45,LVar2,(this->m_callbacks).m_user_data);
  }
  if ((iprev_sibling != 0xffffffffffffffff) && (this->m_cap <= iprev_sibling)) {
    pcVar15 = 
    "check failed: (iprev_sibling == NONE || (iprev_sibling >= 0 && iprev_sibling < m_cap))";
    pcVar16 = local_208;
    for (lVar14 = 10; lVar14 != 0; lVar14 = lVar14 + -1) {
      *(undefined8 *)pcVar16 = *(undefined8 *)pcVar15;
      pcVar15 = pcVar15 + ((ulong)bVar18 * -2 + 1) * 8;
      pcVar16 = pcVar16 + ((ulong)bVar18 * -2 + 1) * 8;
    }
    uStack_1b4 = 0x2929;
    uStack_1b8 = 0x7061635f;
    if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    local_80 = 0;
    uStack_78 = 0x63cc;
    local_70 = 0;
    pcStack_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_60 = 0x65;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x63cc) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x63cc) << 0x40,8);
    LVar3.name.str._0_4_ = 0x200dd7;
    LVar3.name.str._4_4_ = 0;
    LVar3.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_208,0x57,LVar3,(this->m_callbacks).m_user_data);
  }
  if (ichild == 0xffffffffffffffff) {
    n_01 = (NodeData *)0x0;
  }
  else {
    if (this->m_cap <= ichild) {
      if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      local_208[0] = '\0';
      local_208[1] = '\0';
      local_208[2] = '\0';
      local_208[3] = '\0';
      local_208[4] = '\0';
      local_208[5] = '\0';
      local_208[6] = '\0';
      local_208[7] = '\0';
      local_208[8] = 't';
      local_208[9] = 'K';
      local_208[10] = '\0';
      local_208[0xb] = '\0';
      local_208[0xc] = '\0';
      local_208[0xd] = '\0';
      local_208[0xe] = '\0';
      local_208[0xf] = '\0';
      local_208[0x10] = '\0';
      local_208[0x11] = '\0';
      local_208[0x12] = '\0';
      local_208[0x13] = '\0';
      local_208[0x14] = '\0';
      local_208[0x15] = '\0';
      local_208[0x16] = '\0';
      local_208[0x17] = '\0';
      local_208[0x18] = -0x29;
      local_208[0x19] = '\r';
      local_208[0x1a] = ' ';
      local_208[0x1b] = '\0';
      local_208[0x1c] = 0;
      local_208[0x1d] = 0;
      local_208[0x1e] = '\0';
      local_208[0x1f] = '\0';
      local_208[0x20] = 'e';
      local_208[0x21] = '\0';
      local_208[0x22] = '\0';
      local_208[0x23] = '\0';
      local_208[0x24] = '\0';
      local_208[0x25] = 0;
      local_208[0x26] = '\0';
      local_208[0x27] = '\0';
      (*(code *)PTR_error_impl_00243548)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    n_01 = this->m_buf + ichild;
  }
  n_01->m_parent = iparent;
  *(undefined4 *)&n_01->m_next_sibling = 0xffffffff;
  *(undefined4 *)((long)&n_01->m_next_sibling + 4) = 0xffffffff;
  *(undefined4 *)&n_01->m_prev_sibling = 0xffffffff;
  *(undefined4 *)((long)&n_01->m_prev_sibling + 4) = 0xffffffff;
  if (iparent == 0xffffffffffffffff) {
    if (ichild != 0) {
      builtin_strncpy(local_208 + 0x10,"child == 0)",0xc);
      builtin_strncpy(local_208,"check failed: (i",0x10);
      if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      local_a8 = 0;
      uStack_a0 = 0x63d6;
      local_98 = 0;
      pcStack_90 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_88 = 0x65;
      LVar4.super_LineCol.col = 0;
      LVar4.super_LineCol.offset = SUB168(ZEXT816(0x63d6) << 0x40,0);
      LVar4.super_LineCol.line = SUB168(ZEXT816(0x63d6) << 0x40,8);
      LVar4.name.str._0_4_ = 0x200dd7;
      LVar4.name.str._4_4_ = 0;
      LVar4.name.len = 0x65;
      (*(this->m_callbacks).m_error)(local_208,0x1c,LVar4,(this->m_callbacks).m_user_data);
    }
    if (iprev_sibling != 0xffffffffffffffff) {
      builtin_strncpy(local_208,"check failed: (iprev_sibling == NONE)",0x26);
      if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      local_d0 = 0;
      uStack_c8 = 0x63d7;
      local_c0 = 0;
      pcStack_b8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_b0 = 0x65;
      LVar5.super_LineCol.col = 0;
      LVar5.super_LineCol.offset = SUB168(ZEXT816(0x63d7) << 0x40,0);
      LVar5.super_LineCol.line = SUB168(ZEXT816(0x63d7) << 0x40,8);
      LVar5.name.str._0_4_ = 0x200dd7;
      LVar5.name.str._4_4_ = 0;
      LVar5.name.len = 0x65;
      (*(this->m_callbacks).m_error)(local_208,0x26,LVar5,(this->m_callbacks).m_user_data);
    }
  }
  else {
    if (iprev_sibling == 0xffffffffffffffff) {
      local_1a0 = first_child(this,iparent);
    }
    else {
      local_1a0 = next_sibling(this,iprev_sibling);
    }
    if (iparent == 0xffffffffffffffff) {
      pNVar17 = (NodeData *)0x0;
    }
    else {
      if (this->m_cap <= iparent) {
        if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        local_208[0] = '\0';
        local_208[1] = '\0';
        local_208[2] = '\0';
        local_208[3] = '\0';
        local_208[4] = '\0';
        local_208[5] = '\0';
        local_208[6] = '\0';
        local_208[7] = '\0';
        local_208[8] = 't';
        local_208[9] = 'K';
        local_208[10] = '\0';
        local_208[0xb] = '\0';
        local_208[0xc] = '\0';
        local_208[0xd] = '\0';
        local_208[0xe] = '\0';
        local_208[0xf] = '\0';
        local_208[0x10] = '\0';
        local_208[0x11] = '\0';
        local_208[0x12] = '\0';
        local_208[0x13] = '\0';
        local_208[0x14] = '\0';
        local_208[0x15] = '\0';
        local_208[0x16] = '\0';
        local_208[0x17] = '\0';
        local_208[0x18] = -0x29;
        local_208[0x19] = '\r';
        local_208[0x1a] = ' ';
        local_208[0x1b] = '\0';
        local_208[0x1c] = 0;
        local_208[0x1d] = 0;
        local_208[0x1e] = '\0';
        local_208[0x1f] = '\0';
        local_208[0x20] = 'e';
        local_208[0x21] = '\0';
        local_208[0x22] = '\0';
        local_208[0x23] = '\0';
        local_208[0x24] = '\0';
        local_208[0x25] = 0;
        local_208[0x26] = '\0';
        local_208[0x27] = '\0';
        (*(code *)PTR_error_impl_00243548)
                  ("check failed: i >= 0 && i < m_cap",0x21,
                   (anonymous_namespace)::s_default_callbacks);
      }
      pNVar17 = this->m_buf + iparent;
    }
    sVar12 = local_1a0;
    if (iprev_sibling == 0xffffffffffffffff) {
      n = (NodeData *)0x0;
    }
    else {
      if (this->m_cap <= iprev_sibling) {
        if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        local_208[0] = '\0';
        local_208[1] = '\0';
        local_208[2] = '\0';
        local_208[3] = '\0';
        local_208[4] = '\0';
        local_208[5] = '\0';
        local_208[6] = '\0';
        local_208[7] = '\0';
        local_208[8] = 't';
        local_208[9] = 'K';
        local_208[10] = '\0';
        local_208[0xb] = '\0';
        local_208[0xc] = '\0';
        local_208[0xd] = '\0';
        local_208[0xe] = '\0';
        local_208[0xf] = '\0';
        local_208[0x10] = '\0';
        local_208[0x11] = '\0';
        local_208[0x12] = '\0';
        local_208[0x13] = '\0';
        local_208[0x14] = '\0';
        local_208[0x15] = '\0';
        local_208[0x16] = '\0';
        local_208[0x17] = '\0';
        local_208[0x18] = -0x29;
        local_208[0x19] = '\r';
        local_208[0x1a] = ' ';
        local_208[0x1b] = '\0';
        local_208[0x1c] = 0;
        local_208[0x1d] = 0;
        local_208[0x1e] = '\0';
        local_208[0x1f] = '\0';
        local_208[0x20] = 'e';
        local_208[0x21] = '\0';
        local_208[0x22] = '\0';
        local_208[0x23] = '\0';
        local_208[0x24] = '\0';
        local_208[0x25] = 0;
        local_208[0x26] = '\0';
        local_208[0x27] = '\0';
        (*(code *)PTR_error_impl_00243548)
                  ("check failed: i >= 0 && i < m_cap",0x21,
                   (anonymous_namespace)::s_default_callbacks);
      }
      n = this->m_buf + iprev_sibling;
    }
    if (sVar12 == 0xffffffffffffffff) {
      n_00 = (NodeData *)0x0;
    }
    else {
      if (this->m_cap <= sVar12) {
        if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        local_208[0] = '\0';
        local_208[1] = '\0';
        local_208[2] = '\0';
        local_208[3] = '\0';
        local_208[4] = '\0';
        local_208[5] = '\0';
        local_208[6] = '\0';
        local_208[7] = '\0';
        local_208[8] = 't';
        local_208[9] = 'K';
        local_208[10] = '\0';
        local_208[0xb] = '\0';
        local_208[0xc] = '\0';
        local_208[0xd] = '\0';
        local_208[0xe] = '\0';
        local_208[0xf] = '\0';
        local_208[0x10] = '\0';
        local_208[0x11] = '\0';
        local_208[0x12] = '\0';
        local_208[0x13] = '\0';
        local_208[0x14] = '\0';
        local_208[0x15] = '\0';
        local_208[0x16] = '\0';
        local_208[0x17] = '\0';
        local_208[0x18] = -0x29;
        local_208[0x19] = '\r';
        local_208[0x1a] = ' ';
        local_208[0x1b] = '\0';
        local_208[0x1c] = 0;
        local_208[0x1d] = 0;
        local_208[0x1e] = '\0';
        local_208[0x1f] = '\0';
        local_208[0x20] = 'e';
        local_208[0x21] = '\0';
        local_208[0x22] = '\0';
        local_208[0x23] = '\0';
        local_208[0x24] = '\0';
        local_208[0x25] = 0;
        local_208[0x26] = '\0';
        local_208[0x27] = '\0';
        (*(code *)PTR_error_impl_00243548)
                  ("check failed: i >= 0 && i < m_cap",0x21,
                   (anonymous_namespace)::s_default_callbacks);
      }
      n_00 = this->m_buf + sVar12;
    }
    if (n != (NodeData *)0x0) {
      sVar12 = next_sibling(this,iprev_sibling);
      sVar13 = id(this,n_00);
      if (sVar12 != sVar13) {
        builtin_strncpy(local_208,"check failed: (next_sibling(iprev_sibling) == id(nsib))",0x38);
        if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        local_f8 = 0;
        uStack_f0 = 0x63e4;
        local_e8 = 0;
        pcStack_e0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_d8 = 0x65;
        LVar6.super_LineCol.col = 0;
        LVar6.super_LineCol.offset = SUB168(ZEXT816(0x63e4) << 0x40,0);
        LVar6.super_LineCol.line = SUB168(ZEXT816(0x63e4) << 0x40,8);
        LVar6.name.str._0_4_ = 0x200dd7;
        LVar6.name.str._4_4_ = 0;
        LVar6.name.len = 0x65;
        (*(this->m_callbacks).m_error)(local_208,0x38,LVar6,(this->m_callbacks).m_user_data);
      }
      sVar12 = id(this,n);
      n_01->m_prev_sibling = sVar12;
      sVar12 = id(this,n_01);
      n->m_next_sibling = sVar12;
      if (n->m_prev_sibling != 0xffffffffffffffff && n->m_prev_sibling == sVar12) {
        pcVar15 = 
        "check failed: (psib->m_prev_sibling != psib->m_next_sibling || psib->m_prev_sibling == NONE)"
        ;
        pcVar16 = local_208;
        for (lVar14 = 0xb; lVar14 != 0; lVar14 = lVar14 + -1) {
          *(undefined8 *)pcVar16 = *(undefined8 *)pcVar15;
          pcVar15 = pcVar15 + ((ulong)bVar18 * -2 + 1) * 8;
          pcVar16 = pcVar16 + ((ulong)bVar18 * -2 + 1) * 8;
        }
        local_1ac = 0;
        local_1b0 = 0x29454e4f;
        if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        local_120 = 0;
        uStack_118 = 0x63e7;
        local_110 = 0;
        pcStack_108 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_100 = 0x65;
        LVar7.super_LineCol.col = 0;
        LVar7.super_LineCol.offset = SUB168(ZEXT816(0x63e7) << 0x40,0);
        LVar7.super_LineCol.line = SUB168(ZEXT816(0x63e7) << 0x40,8);
        LVar7.name.str._0_4_ = 0x200dd7;
        LVar7.name.str._4_4_ = 0;
        LVar7.name.len = 0x65;
        (*(this->m_callbacks).m_error)(local_208,0x5d,LVar7,(this->m_callbacks).m_user_data);
      }
    }
    if (n_00 != (NodeData *)0x0) {
      sVar12 = prev_sibling(this,local_1a0);
      sVar13 = id(this,n);
      if (sVar12 != sVar13) {
        builtin_strncpy(local_208,"check failed: (prev_sibling(inext_sibling) == id(psib))",0x38);
        if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        local_148 = 0;
        uStack_140 = 0x63ec;
        local_138 = 0;
        pcStack_130 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_128 = 0x65;
        LVar8.super_LineCol.col = 0;
        LVar8.super_LineCol.offset = SUB168(ZEXT816(0x63ec) << 0x40,0);
        LVar8.super_LineCol.line = SUB168(ZEXT816(0x63ec) << 0x40,8);
        LVar8.name.str._0_4_ = 0x200dd7;
        LVar8.name.str._4_4_ = 0;
        LVar8.name.len = 0x65;
        (*(this->m_callbacks).m_error)(local_208,0x38,LVar8,(this->m_callbacks).m_user_data);
      }
      sVar12 = id(this,n_00);
      n_01->m_next_sibling = sVar12;
      sVar12 = id(this,n_01);
      n_00->m_prev_sibling = sVar12;
      if ((sVar12 != 0xffffffffffffffff) && (sVar12 == n_00->m_next_sibling)) {
        pcVar15 = 
        "check failed: (nsib->m_prev_sibling != nsib->m_next_sibling || nsib->m_prev_sibling == NONE)"
        ;
        pcVar16 = local_208;
        for (lVar14 = 0xb; lVar14 != 0; lVar14 = lVar14 + -1) {
          *(undefined8 *)pcVar16 = *(undefined8 *)pcVar15;
          pcVar15 = pcVar15 + ((ulong)bVar18 * -2 + 1) * 8;
          pcVar16 = pcVar16 + ((ulong)bVar18 * -2 + 1) * 8;
        }
        local_1ac = 0;
        local_1b0 = 0x29454e4f;
        if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        local_170 = 0;
        uStack_168 = 0x63ef;
        local_160 = 0;
        pcStack_158 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_150 = 0x65;
        LVar9.super_LineCol.col = 0;
        LVar9.super_LineCol.offset = SUB168(ZEXT816(0x63ef) << 0x40,0);
        LVar9.super_LineCol.line = SUB168(ZEXT816(0x63ef) << 0x40,8);
        LVar9.name.str._0_4_ = 0x200dd7;
        LVar9.name.str._4_4_ = 0;
        LVar9.name.len = 0x65;
        (*(this->m_callbacks).m_error)(local_208,0x5d,LVar9,(this->m_callbacks).m_user_data);
      }
    }
    if (pNVar17->m_first_child == 0xffffffffffffffff) {
      if (pNVar17->m_last_child != 0xffffffffffffffff) {
        builtin_strncpy(local_208 + 0x20,"ild == NONE)",0xd);
        builtin_strncpy(local_208 + 0x10,"arent->m_last_ch",0x10);
        builtin_strncpy(local_208,"check failed: (p",0x10);
        if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        local_198 = 0;
        uStack_190 = 0x63f4;
        local_188 = 0;
        pcStack_180 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_178 = 0x65;
        LVar10.super_LineCol.col = 0;
        LVar10.super_LineCol.offset = SUB168(ZEXT816(0x63f4) << 0x40,0);
        LVar10.super_LineCol.line = SUB168(ZEXT816(0x63f4) << 0x40,8);
        LVar10.name.str._0_4_ = 0x200dd7;
        LVar10.name.str._4_4_ = 0;
        LVar10.name.len = 0x65;
        (*(this->m_callbacks).m_error)(local_208,0x2d,LVar10,(this->m_callbacks).m_user_data);
      }
      sVar12 = id(this,n_01);
      pNVar17->m_first_child = sVar12;
    }
    else {
      if (n_01->m_next_sibling == pNVar17->m_first_child) {
        sVar12 = id(this,n_01);
        pNVar17->m_first_child = sVar12;
      }
      if (n_01->m_prev_sibling != pNVar17->m_last_child) {
        return;
      }
    }
    sVar12 = id(this,n_01);
    pNVar17->m_last_child = sVar12;
  }
  return;
}

Assistant:

void Tree::_set_hierarchy(size_t ichild, size_t iparent, size_t iprev_sibling)
{
    _RYML_CB_ASSERT(m_callbacks, iparent == NONE || (iparent >= 0 && iparent < m_cap));
    _RYML_CB_ASSERT(m_callbacks, iprev_sibling == NONE || (iprev_sibling >= 0 && iprev_sibling < m_cap));

    NodeData *C4_RESTRICT child = get(ichild);

    child->m_parent = iparent;
    child->m_prev_sibling = NONE;
    child->m_next_sibling = NONE;

    if(iparent == NONE)
    {
        _RYML_CB_ASSERT(m_callbacks, ichild == 0);
        _RYML_CB_ASSERT(m_callbacks, iprev_sibling == NONE);
    }

    if(iparent == NONE)
        return;

    size_t inext_sibling = iprev_sibling != NONE ? next_sibling(iprev_sibling) : first_child(iparent);
    NodeData *C4_RESTRICT parent = get(iparent);
    NodeData *C4_RESTRICT psib   = get(iprev_sibling);
    NodeData *C4_RESTRICT nsib   = get(inext_sibling);

    if(psib)
    {
        _RYML_CB_ASSERT(m_callbacks, next_sibling(iprev_sibling) == id(nsib));
        child->m_prev_sibling = id(psib);
        psib->m_next_sibling = id(child);
        _RYML_CB_ASSERT(m_callbacks, psib->m_prev_sibling != psib->m_next_sibling || psib->m_prev_sibling == NONE);
    }

    if(nsib)
    {
        _RYML_CB_ASSERT(m_callbacks, prev_sibling(inext_sibling) == id(psib));
        child->m_next_sibling = id(nsib);
        nsib->m_prev_sibling = id(child);
        _RYML_CB_ASSERT(m_callbacks, nsib->m_prev_sibling != nsib->m_next_sibling || nsib->m_prev_sibling == NONE);
    }

    if(parent->m_first_child == NONE)
    {
        _RYML_CB_ASSERT(m_callbacks, parent->m_last_child == NONE);
        parent->m_first_child = id(child);
        parent->m_last_child = id(child);
    }
    else
    {
        if(child->m_next_sibling == parent->m_first_child)
            parent->m_first_child = id(child);

        if(child->m_prev_sibling == parent->m_last_child)
            parent->m_last_child = id(child);
    }
}